

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueCopyIntoBuffer
          (VariableDatum *this,KOCTET *Buffer,KUINT16 BufferSize)

{
  KException *this_00;
  pointer pDVar1;
  double dVar2;
  ushort local_64;
  ushort local_62;
  KUINT16 j;
  const_iterator cStack_60;
  KUINT16 i;
  const_iterator citr;
  allocator<char> local_41;
  KString local_40;
  uint local_20;
  ushort local_1a;
  KUINT32 sizeInOctets;
  KUINT16 BufferSize_local;
  KOCTET *Buffer_local;
  VariableDatum *this_local;
  
  local_1a = BufferSize;
  _sizeInOctets = Buffer;
  Buffer_local = (KOCTET *)this;
  dVar2 = ceil((double)this->m_ui32DatumLength * 0.125);
  local_20 = (uint)(long)dVar2;
  if (local_1a < local_20) {
    citr._M_current._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GetDatumValueCopyIntoBuffer",&local_41);
    KException::KException(this_00,&local_40,1);
    citr._M_current._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  cStack_60 = std::
              vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
              ::begin(&this->m_v8DatumValue);
  local_62 = 0;
  while (local_62 < local_20) {
    local_64 = 0;
    for (; local_62 < local_20 && local_64 < 8; local_62 = local_62 + 1) {
      pDVar1 = __gnu_cxx::
               __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
               ::operator->(&stack0xffffffffffffffa0);
      _sizeInOctets[local_62] = pDVar1->Buffer[local_64];
      local_64 = local_64 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::VariableDatum::DatumEntry_*,_std::vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>_>
    ::operator++(&stack0xffffffffffffffa0);
  }
  return;
}

Assistant:

void VariableDatum::GetDatumValueCopyIntoBuffer(KOCTET *Buffer, KUINT16 BufferSize) const noexcept(false)
{
    KUINT32 sizeInOctets = ceil( m_ui32DatumLength / 8.0 );

    if( BufferSize < sizeInOctets )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    // Copy the data into the buffer, octet by octet
    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();

    KUINT16 i = 0;

    while( i < sizeInOctets )
    {
        for( KUINT16 j = 0; i < sizeInOctets && j < 8; ++j, ++i )
        {
            Buffer[i] = citr->Buffer[j];
        }
        ++citr;
    }
}